

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O3

void __thiscall ftxui::ComponentBase::Detach(ComponentBase *this)

{
  ComponentBase *pCVar1;
  shared_ptr<ftxui::ComponentBase> *psVar2;
  shared_ptr<ftxui::ComponentBase> *psVar3;
  shared_ptr<ftxui::ComponentBase> *psVar4;
  long lVar5;
  iterator __position;
  ulong uVar6;
  
  pCVar1 = this->parent_;
  if (pCVar1 == (ComponentBase *)0x0) {
    return;
  }
  psVar4 = (pCVar1->children_).
           super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (pCVar1->children_).
           super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar6 = (long)psVar2 - (long)psVar4;
  if (0 < (long)uVar6 >> 6) {
    psVar3 = (shared_ptr<ftxui::ComponentBase> *)
             ((long)&(psVar4->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr + (uVar6 & 0xffffffffffffffc0));
    lVar5 = ((long)uVar6 >> 6) + 1;
    __position._M_current = psVar4 + 2;
    do {
      if (__position._M_current[-2].
          super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr == this) {
        __position._M_current = __position._M_current + -2;
        goto LAB_0013aebe;
      }
      if (__position._M_current[-1].
          super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr == this) {
        __position._M_current = __position._M_current + -1;
        goto LAB_0013aebe;
      }
      if (((__position._M_current)->
          super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr == this)
      goto LAB_0013aebe;
      if (__position._M_current[1].
          super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr == this) {
        __position._M_current = __position._M_current + 1;
        goto LAB_0013aebe;
      }
      lVar5 = lVar5 + -1;
      __position._M_current = __position._M_current + 4;
    } while (1 < lVar5);
    uVar6 = (long)psVar2 - (long)psVar3;
    psVar4 = psVar3;
  }
  lVar5 = (long)uVar6 >> 4;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      __position._M_current = psVar2;
      if ((lVar5 != 3) ||
         (__position._M_current = psVar4,
         (psVar4->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
         this)) goto LAB_0013aebe;
      psVar4 = psVar4 + 1;
    }
    __position._M_current = psVar4;
    if ((psVar4->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
        this) goto LAB_0013aebe;
    psVar4 = psVar4 + 1;
  }
  __position._M_current = psVar2;
  if ((psVar4->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr == this)
  {
    __position._M_current = psVar4;
  }
LAB_0013aebe:
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::_M_erase(&pCVar1->children_,__position);
  this->parent_ = (ComponentBase *)0x0;
  return;
}

Assistant:

void ComponentBase::Detach() {
  if (!parent_)
    return;
  auto it = std::find_if(std::begin(parent_->children_),  //
                         std::end(parent_->children_),    //
                         [this](const Component& that) {  //
                           return this == that.get();
                         });
  parent_->children_.erase(it);
  parent_ = nullptr;
}